

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

void ncnn::cubic_coeffs(int w,int outw,int *xofs,float *alpha)

{
  float fVar1;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  double dVar2;
  int sx;
  float fx;
  int dx;
  double scale;
  undefined4 local_2c;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < in_ESI; local_24 = local_24 + 1) {
    fVar1 = ((float)local_24 + 0.5) * ((float)in_EDI / (float)in_ESI) - 0.5;
    dVar2 = std::floor((double)(ulong)(uint)fVar1);
    local_2c = (uint)SUB84(dVar2,0);
    interpolate_cubic(fVar1 - (float)(int)local_2c,(float *)(in_RCX + (long)(local_24 << 2) * 4));
    if (0x7fffffff < local_2c) {
      local_2c = 1;
      *(float *)(in_RCX + (long)(local_24 << 2) * 4) =
           1.0 - *(float *)(in_RCX + (long)(local_24 * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 2) * 4) = 0;
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 3) * 4) = 0;
    }
    if (local_2c == 0) {
      local_2c = 1;
      *(float *)(in_RCX + (long)(local_24 << 2) * 4) =
           *(float *)(in_RCX + (long)(local_24 << 2) * 4) +
           *(float *)(in_RCX + (long)(local_24 * 4 + 1) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 3) * 4) = 0;
    }
    if (local_2c == in_EDI - 2U) {
      local_2c = in_EDI - 3;
      *(float *)(in_RCX + (long)(local_24 * 4 + 3) * 4) =
           *(float *)(in_RCX + (long)(local_24 * 4 + 2) * 4) +
           *(float *)(in_RCX + (long)(local_24 * 4 + 3) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 1) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 1) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 << 2) * 4) = 0;
    }
    if (in_EDI + -1 <= (int)local_2c) {
      local_2c = in_EDI - 3;
      *(float *)(in_RCX + (long)(local_24 * 4 + 3) * 4) =
           1.0 - *(float *)(in_RCX + (long)(local_24 << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 2) * 4) =
           *(undefined4 *)(in_RCX + (long)(local_24 << 2) * 4);
      *(undefined4 *)(in_RCX + (long)(local_24 * 4 + 1) * 4) = 0;
      *(undefined4 *)(in_RCX + (long)(local_24 << 2) * 4) = 0;
    }
    *(uint *)(in_RDX + (long)local_24 * 4) = local_2c;
  }
  return;
}

Assistant:

static void cubic_coeffs(int w, int outw, int* xofs, float* alpha)
{
    double scale = (double)w / outw;

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        int sx = static_cast<int>(floor(fx));
        fx -= sx;

        interpolate_cubic(fx, alpha + dx*4);

        if (sx <= -1)
        {
            sx = 1;
            alpha[dx*4 +0] = 1.f - alpha[dx*4 +3];
            alpha[dx*4 +1] = alpha[dx*4 +3];
            alpha[dx*4 +2] = 0.f;
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == 0)
        {
            sx = 1;
            alpha[dx*4 +0] = alpha[dx*4 +0] + alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +2];
            alpha[dx*4 +2] = alpha[dx*4 +3];
            alpha[dx*4 +3] = 0.f;
        }
        if (sx == w - 2)
        {
            sx = w - 3;
            alpha[dx*4 +3] = alpha[dx*4 +2] + alpha[dx*4 +3];
            alpha[dx*4 +2] = alpha[dx*4 +1];
            alpha[dx*4 +1] = alpha[dx*4 +0];
            alpha[dx*4 +0] = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 3;
            alpha[dx*4 +3] = 1.f - alpha[dx*4 +0];
            alpha[dx*4 +2] = alpha[dx*4 +0];
            alpha[dx*4 +1] = 0.f;
            alpha[dx*4 +0] = 0.f;
        }

        xofs[dx] = sx;
    }
}